

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsc.c
# Opt level: O1

int * Dsc_ComputeMatches(char *p)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int *piVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int pNested [16];
  int local_48 [16];
  
  if (*p != '\0') {
    lVar3 = 0;
    piVar6 = Dsc_ComputeMatches::pMatches;
    iVar7 = 0;
    do {
      *piVar6 = 0;
      bVar1 = p[lVar3];
      uVar4 = bVar1 - 0x28;
      if (uVar4 < 0x36) {
        if ((0x8000000100001U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
          if ((0x20000000400002U >> ((ulong)uVar4 & 0x3f) & 1) == 0) goto LAB_0051924a;
          goto LAB_0051925f;
        }
LAB_00519256:
        iVar8 = iVar7 + 1;
        piVar5 = local_48;
LAB_00519270:
        piVar5[iVar7] = (int)lVar3;
        iVar7 = iVar8;
      }
      else {
LAB_0051924a:
        if (bVar1 == 0x7d) {
LAB_0051925f:
          iVar8 = iVar7 + -1;
          iVar7 = local_48[(long)iVar7 + -1];
          piVar5 = Dsc_ComputeMatches::pMatches;
          goto LAB_00519270;
        }
        if (bVar1 == 0x7b) goto LAB_00519256;
      }
      if (0xf < iVar7) {
        __assert_fail("nNested < DSC_MAX_VAR",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dsc/dsc.c"
                      ,0x1ce,"int *Dsc_ComputeMatches(char *)");
      }
      piVar6 = piVar6 + 1;
      lVar2 = lVar3 + 1;
      lVar3 = lVar3 + 1;
    } while (p[lVar2] != '\0');
    if (iVar7 != 0) {
      __assert_fail("nNested == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dsc/dsc.c"
                    ,0x1d0,"int *Dsc_ComputeMatches(char *)");
    }
  }
  return Dsc_ComputeMatches::pMatches;
}

Assistant:

int * Dsc_ComputeMatches( char * p )
{
    static int pMatches[DSC_MAX_VAR];
    int pNested[DSC_MAX_VAR];
    int v, nNested = 0;
    for ( v = 0; p[v]; v++ )
    {
        pMatches[v] = 0;
        if ( p[v] == '(' || p[v] == '[' || p[v] == '<' || p[v] == '{' )
            pNested[nNested++] = v;
        else if ( p[v] == ')' || p[v] == ']' || p[v] == '>' || p[v] == '}' )
            pMatches[pNested[--nNested]] = v;
        assert( nNested < DSC_MAX_VAR );
    }
    assert( nNested == 0 );
    return pMatches;
}